

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

uint64_t connection_handle_deadlines(CONNECTION_HANDLE connection)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  LOGGER_LOG p_Var4;
  LOGGER_LOG local_68;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  uint64_t time_since_last_sent;
  uint64_t remote_idle_timeout;
  uint64_t time_since_last_received;
  LOGGER_LOG l_1;
  tickcounter_ms_t current_ms;
  LOGGER_LOG l;
  uint64_t remote_deadline;
  uint64_t local_deadline;
  CONNECTION_HANDLE connection_local;
  
  remote_deadline = 0xffffffffffffffff;
  l = (LOGGER_LOG)0xffffffffffffffff;
  local_deadline = (uint64_t)connection;
  if (connection == (CONNECTION_HANDLE)0x0) {
    current_ms = (tickcounter_ms_t)xlogging_get_log_function();
    if ((LOGGER_LOG)current_ms != (LOGGER_LOG)0x0) {
      (*(code *)current_ms)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"connection_handle_deadlines",0x6e3,1,"NULL connection");
    }
  }
  else {
    iVar1 = tickcounter_get_current_ms(connection->tick_counter,(tickcounter_ms_t *)&l_1);
    if (iVar1 == 0) {
      if (((*(byte *)(local_deadline + 0xe0) >> 1 & 1) != 0) &&
         (*(int *)(local_deadline + 0xb0) != 0)) {
        uVar3 = (long)l_1 - *(long *)(local_deadline + 200);
        if (uVar3 < *(uint *)(local_deadline + 0xb0)) {
          remote_deadline = *(uint *)(local_deadline + 0xb0) - uVar3;
        }
        else {
          remote_deadline = 0;
          close_connection_with_error
                    ((CONNECTION_HANDLE)local_deadline,"amqp:internal-error",
                     "No frame received for the idle timeout",(AMQP_VALUE)0x0);
        }
      }
      if ((remote_deadline != 0) && (*(int *)(local_deadline + 0xb4) != 0)) {
        p_Var2 = (LOGGER_LOG)(ulong)*(uint *)(local_deadline + 0xb8);
        if (l_1 + -*(long *)(local_deadline + 0xd0) < p_Var2) {
          l = p_Var2 + -(long)(l_1 + -*(long *)(local_deadline + 0xd0));
        }
        else {
          *(undefined8 *)(local_deadline + 0x58) = 0;
          iVar1 = amqp_frame_codec_encode_empty_frame
                            (*(AMQP_FRAME_CODEC_HANDLE *)(local_deadline + 0x20),0,on_bytes_encoded,
                             (void *)local_deadline);
          if (iVar1 == 0) {
            if (((*(byte *)(local_deadline + 0xe0) >> 3 & 1) == 1) &&
               (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
              (*p_Var4)(AZ_LOG_TRACE,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"connection_handle_deadlines",0x71a,1,"-> Empty frame");
            }
            *(LOGGER_LOG *)(local_deadline + 0xd0) = l_1;
            l = p_Var2;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"connection_handle_deadlines",0x712,1,"Encoding the empty frame failed");
            }
            close_connection_with_error
                      ((CONNECTION_HANDLE)local_deadline,"amqp:internal-error",
                       "Cannot send empty frame",(AMQP_VALUE)0x0);
          }
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_handle_deadlines",0x6eb,1,"Could not get tick counter value");
      }
      close_connection_with_error
                ((CONNECTION_HANDLE)local_deadline,"amqp:internal-error","Could not get tick count",
                 (AMQP_VALUE)0x0);
    }
  }
  if (l < remote_deadline) {
    local_68 = l;
  }
  else {
    local_68 = (LOGGER_LOG)remote_deadline;
  }
  return (uint64_t)local_68;
}

Assistant:

uint64_t connection_handle_deadlines(CONNECTION_HANDLE connection)
{
    uint64_t local_deadline = (uint64_t)-1;
    uint64_t remote_deadline = (uint64_t)-1;

    if (connection == NULL)
    {
        LogError("NULL connection");
    }
    else
    {
        tickcounter_ms_t current_ms;

        if (tickcounter_get_current_ms(connection->tick_counter, &current_ms) != 0)
        {
            LogError("Could not get tick counter value");
            close_connection_with_error(connection, "amqp:internal-error", "Could not get tick count", NULL);
        }
        else
        {
            if (connection->idle_timeout_specified && (connection->idle_timeout != 0))
            {
                /* Calculate time until configured idle timeout expires */

                uint64_t time_since_last_received = current_ms - connection->last_frame_received_time;
                if (time_since_last_received < connection->idle_timeout)
                {
                    local_deadline = connection->idle_timeout - time_since_last_received;
                }
                else
                {
                    local_deadline = 0;

                    /* close connection */
                    close_connection_with_error(connection, "amqp:internal-error", "No frame received for the idle timeout", NULL);
                }
            }

            if (local_deadline != 0 && connection->remote_idle_timeout != 0)
            {
                /* Calculate time until remote idle timeout expires */

                uint64_t remote_idle_timeout = connection->remote_idle_timeout_send_frame_millisecond;
                uint64_t time_since_last_sent = current_ms - connection->last_frame_sent_time;

                if (time_since_last_sent < remote_idle_timeout)
                {
                    remote_deadline = remote_idle_timeout - time_since_last_sent;
                }
                else
                {
                    connection->on_send_complete = NULL;
                    if (amqp_frame_codec_encode_empty_frame(connection->amqp_frame_codec, 0, on_bytes_encoded, connection) != 0)
                    {
                        LogError("Encoding the empty frame failed");
                        /* close connection */
                        close_connection_with_error(connection, "amqp:internal-error", "Cannot send empty frame", NULL);
                    }
                    else
                    {
                        if (connection->is_trace_on == 1)
                        {
                            LOG(AZ_LOG_TRACE, LOG_LINE, "-> Empty frame");
                        }

                        connection->last_frame_sent_time = current_ms;

                        remote_deadline = remote_idle_timeout;
                    }
                }
            }
        }
    }

    /* Return the shorter of each deadline, or 0 to indicate connection closed */
    return local_deadline > remote_deadline ? remote_deadline : local_deadline;
}